

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O2

bool __thiscall Sock::IsConnected(Sock *this,string *errmsg)

{
  int iVar1;
  undefined4 extraout_var;
  int *piVar2;
  bool bVar3;
  char *__s;
  long in_FS_OFFSET;
  int iStack_44;
  char c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_socket == 0xffffffff) {
    __s = "not connected";
LAB_00b071d8:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (errmsg,__s);
  }
  else {
    iVar1 = (*this->_vptr_Sock[4])(this,&c,1,2);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      __s = "closed";
      goto LAB_00b071d8;
    }
    bVar3 = true;
    if (CONCAT44(extraout_var,iVar1) != -1) goto LAB_00b071e2;
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (((iVar1 == 4) || (iVar1 == 0xb)) || (iVar1 == 0x73)) goto LAB_00b071e2;
    SysErrorString_abi_cxx11_(iStack_44);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (errmsg,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  bVar3 = false;
LAB_00b071e2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool Sock::IsConnected(std::string& errmsg) const
{
    if (m_socket == INVALID_SOCKET) {
        errmsg = "not connected";
        return false;
    }

    char c;
    switch (Recv(&c, sizeof(c), MSG_PEEK)) {
    case -1: {
        const int err = WSAGetLastError();
        if (IOErrorIsPermanent(err)) {
            errmsg = NetworkErrorString(err);
            return false;
        }
        return true;
    }
    case 0:
        errmsg = "closed";
        return false;
    default:
        return true;
    }
}